

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_refact::llm_build_refact
          (llm_build_refact *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int il_00;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  ggml_tensor *pgVar7;
  ggml_tensor *pgVar8;
  ggml_tensor *name;
  const_reference pvVar9;
  ggml_tensor *pgVar10;
  ggml_tensor *pgVar11;
  pointer plVar12;
  ggml_tensor *pgVar13;
  ggml_tensor *in_RCX;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *in_RDI;
  ggml_cgraph *unaff_retaddr;
  llm_graph_input_attn_kv_unified *in_stack_00000008;
  llm_graph_context *in_stack_00000010;
  ggml_tensor *in_stack_00000020;
  ggml_tensor *in_stack_00000028;
  ggml_tensor *in_stack_00000030;
  ggml_tensor *in_stack_00000038;
  int in_stack_00000040;
  ggml_tensor *ffn_inp;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  ggml_tensor *inpSA;
  int il;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  int64_t n_embd_head;
  ggml_tensor *in_stack_fffffffffffffe18;
  int iVar14;
  llm_graph_context *in_stack_fffffffffffffe20;
  ggml_tensor *in_stack_fffffffffffffe28;
  ggml_tensor *cur_00;
  ggml_tensor *in_stack_fffffffffffffe30;
  ggml_tensor *mw;
  ggml_tensor *in_stack_fffffffffffffe38;
  undefined4 uVar15;
  llm_graph_context *in_stack_fffffffffffffe40;
  ggml_tensor *in_stack_fffffffffffffe70;
  ggml_tensor *in_stack_fffffffffffffe78;
  ggml_tensor *in_stack_fffffffffffffe80;
  ggml_tensor *pgVar16;
  ggml_tensor *in_stack_fffffffffffffeb0;
  ggml_tensor *cur_01;
  ggml_tensor *in_stack_fffffffffffffec0;
  ggml_tensor *in_stack_fffffffffffffed0;
  ggml_tensor *in_stack_fffffffffffffed8;
  ggml_tensor *in_stack_fffffffffffffee0;
  llm_ffn_op_type type_op;
  llm_ffn_gate_type type_gate;
  ggml_tensor *in_stack_ffffffffffffff28;
  llm_graph_context *in_stack_ffffffffffffff30;
  ggml_tensor *local_60;
  int local_54;
  ggml_tensor *local_48;
  ggml_tensor *local_40;
  
  pgVar13 = in_RDI;
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffe30,
             (llm_graph_params *)in_stack_fffffffffffffe28);
  uVar1 = *(uint *)(in_RDI->buffer + 0x24);
  if (uVar1 != *(uint *)(in_RDI->buffer + 0x20)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x15c0,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  local_48 = llm_graph_context::build_inp_embd(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  pgVar4 = (ggml_tensor *)
           llm_graph_context::build_attn_inp_kv_unified
                     ((llm_graph_context *)in_stack_fffffffffffffec0);
  for (local_54 = 0; iVar14 = (int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
      (long)local_54 < in_RDI->ne[3]; local_54 = local_54 + 1) {
    local_60 = local_48;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs,
               (long)local_54);
    llm_graph_context::build_norm
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
               in_stack_fffffffffffffe28,(llm_norm_type)((ulong)in_stack_fffffffffffffe20 >> 0x20),
               (int)in_stack_fffffffffffffe20);
    uVar15 = (undefined4)((ulong)in_stack_fffffffffffffe38 >> 0x20);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
               (char *)in_stack_fffffffffffffe20,iVar14);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs,
               (long)local_54);
    pgVar5 = llm_graph_context::build_lora_mm
                       ((llm_graph_context *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                        in_stack_fffffffffffffe70);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
               (char *)in_stack_fffffffffffffe20,iVar14);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs,
               (long)local_54);
    pgVar6 = llm_graph_context::build_lora_mm
                       ((llm_graph_context *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                        in_stack_fffffffffffffe70);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
               (char *)in_stack_fffffffffffffe20,iVar14);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs,
               (long)local_54);
    pgVar7 = llm_graph_context::build_lora_mm
                       ((llm_graph_context *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                        in_stack_fffffffffffffe70);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
               (char *)in_stack_fffffffffffffe20,iVar14);
    il_00 = ggml_reshape_3d(in_RDI->src[5],pgVar5,uVar1,in_RDI->nb[3],
                            (long)*(int *)(in_RDI->src + 2));
    uVar2._0_4_ = in_RDI->op;
    uVar2._4_4_ = in_RDI->op_params[0];
    pgVar8 = (ggml_tensor *)
             ggml_reshape_3d(in_RDI->src[5],pgVar6,uVar1,uVar2,(long)*(int *)(in_RDI->src + 2));
    uVar3._0_4_ = in_RDI->op;
    uVar3._4_4_ = in_RDI->op_params[0];
    name = (ggml_tensor *)
           ggml_reshape_3d(in_RDI->src[5],pgVar7,uVar1,uVar3,(long)*(int *)(in_RDI->src + 2));
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
               (char *)in_stack_fffffffffffffe20,iVar14);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
               (char *)in_stack_fffffffffffffe20,iVar14);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
               (char *)in_stack_fffffffffffffe20,iVar14);
    pgVar7 = pgVar4;
    pgVar16 = in_RCX;
    pvVar9 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs
                        ,(long)local_54);
    type_op = (llm_ffn_op_type)in_RCX;
    type_gate = (llm_ffn_gate_type)pvVar9->wo;
    sqrtf((float)uVar1);
    pgVar11 = (ggml_tensor *)CONCAT44(uVar15,local_54);
    mw = (ggml_tensor *)0x0;
    cur_00 = (ggml_tensor *)0x0;
    pgVar5 = name;
    pgVar6 = pgVar8;
    local_40 = llm_graph_context::build_attn
                         (in_stack_00000010,in_stack_00000008,unaff_retaddr,pgVar13,in_RSI,in_RDX,
                          in_stack_00000020,in_stack_00000028,in_stack_00000030,in_stack_00000038,
                          (float)((ulong)pgVar16 >> 0x20),in_stack_00000040);
    iVar14 = (int)((ulong)pgVar8 >> 0x20);
    in_RCX = pgVar16;
    if ((long)local_54 == in_RDI->ne[3] + -1) {
      pgVar8 = llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffe70);
      in_stack_fffffffffffffee0 = pgVar8;
      local_40 = (ggml_tensor *)ggml_get_rows(in_RDI->src[5],local_40,pgVar8);
      in_stack_fffffffffffffed8 = local_40;
      in_stack_fffffffffffffed0 = (ggml_tensor *)ggml_get_rows(in_RDI->src[5],local_48,pgVar8);
      local_60 = in_stack_fffffffffffffed0;
      in_RCX = pgVar16;
    }
    pgVar10 = (ggml_tensor *)ggml_add(in_RDI->src[5],local_40,local_60);
    llm_graph_context::cb((llm_graph_context *)mw,cur_00,(char *)name,iVar14);
    cur_01 = pgVar10;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs,
               (long)local_54);
    pgVar11 = llm_graph_context::build_norm
                        (in_stack_fffffffffffffe40,pgVar11,mw,cur_00,
                         (llm_norm_type)((ulong)name >> 0x20),(int)name);
    llm_graph_context::cb((llm_graph_context *)mw,cur_00,(char *)name,iVar14);
    pvVar9 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs
                        ,(long)local_54);
    pgVar16 = pvVar9->ffn_up;
    pvVar9 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs
                        ,(long)local_54);
    pgVar8 = pvVar9->ffn_gate;
    pvVar9 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x13].view_offs
                        ,(long)local_54);
    in_stack_fffffffffffffe28 = pvVar9->ffn_down;
    in_stack_fffffffffffffe40 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffe38 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffe30 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffe20 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffe18 = (ggml_tensor *)0x0;
    pgVar5 = llm_graph_context::build_ffn
                       ((llm_graph_context *)pgVar11,cur_01,in_stack_fffffffffffffeb0,
                        (ggml_tensor *)&stack0xfffffffffffffe18,pgVar8,pgVar16,
                        in_stack_fffffffffffffed0,in_stack_fffffffffffffed8,
                        in_stack_fffffffffffffee0,pgVar5,pgVar6,pgVar7,type_op,type_gate,il_00);
    in_stack_fffffffffffffeb0 = pgVar5;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
               (char *)in_stack_fffffffffffffe20,(int)((ulong)in_stack_fffffffffffffe18 >> 0x20));
    ggml_add(in_RDI->src[5],pgVar5,pgVar10);
    local_48 = llm_graph_context::build_cvec(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,0);
    in_stack_fffffffffffffe80 = local_48;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
               (char *)in_stack_fffffffffffffe20,(int)((ulong)in_stack_fffffffffffffe18 >> 0x20));
  }
  pgVar4 = llm_graph_context::build_norm
                     (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                      in_stack_fffffffffffffe28,
                      (llm_norm_type)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                      (int)in_stack_fffffffffffffe20);
  pgVar13 = pgVar4;
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
             (char *)in_stack_fffffffffffffe20,iVar14);
  plVar12 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4c6097);
  plVar12->t_embd = pgVar4;
  pgVar13 = llm_graph_context::build_lora_mm
                      ((llm_graph_context *)in_stack_fffffffffffffe80,pgVar13,
                       in_stack_fffffffffffffe70);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
             (char *)in_stack_fffffffffffffe20,iVar14);
  plVar12 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4c611c);
  plVar12->t_logits = pgVar13;
  ggml_build_forward_expand(in_RCX,pgVar13);
  return;
}

Assistant:

llm_build_refact(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                cb(Qcur, "Qcur", il);

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                cb(Kcur, "Kcur", il);

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                cb(Vcur, "Vcur", il);

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, NULL,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            // feed-forward network
            {
                cur = build_norm(ffn_inp,
                        model.layers[il].ffn_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "ffn_norm", il);

                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   NULL, NULL,
                        model.layers[il].ffn_gate, NULL, NULL,
                        model.layers[il].ffn_down, NULL, NULL,
                        NULL,
                        LLM_FFN_SILU, LLM_FFN_PAR, il);
                cb(cur, "ffn_out", il);
            }

            cur = ggml_add(ctx0, cur, ffn_inp);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }